

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

string * ToUpper_abi_cxx11_(string_view str)

{
  long lVar1;
  char __c;
  const_iterator pvVar2;
  const_iterator pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  value_type ch;
  const_iterator __end1;
  const_iterator __begin1;
  string_view *__range1;
  string *r;
  undefined7 in_stack_ffffffffffffff88;
  char in_stack_ffffffffffffff8f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_RDI);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)
                      CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)
                      CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  for (; pvVar2 != pvVar3; pvVar2 = pvVar2 + 1) {
    __c = ToUpper(in_stack_ffffffffffffff8f);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_RDI,__c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string ToUpper(std::string_view str)
{
    std::string r;
    r.reserve(str.size());
    for (auto ch : str) r += ToUpper(ch);
    return r;
}